

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

int __thiscall
vkt::anon_unknown_0::ShaderLibraryGroup::init(ShaderLibraryGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  Archive *archive;
  size_type sVar1;
  const_reference ppTVar2;
  ulong local_40;
  size_t ndx;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  ShaderCaseFactory caseFactory;
  ShaderLibraryGroup *this_local;
  
  ShaderCaseFactory::ShaderCaseFactory
            ((ShaderCaseFactory *)
             &children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             (this->super_TestCaseGroup).super_TestNode.m_testCtx);
  archive = tcu::TestContext::getArchive((this->super_TestCaseGroup).super_TestNode.m_testCtx);
  glu::sl::parseFile((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&ndx,archive,
                     &this->m_filename,
                     (ShaderCaseFactory *)
                     &children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_40 = 0;
  while( true ) {
    sVar1 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::size
                      ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&ndx);
    if (sVar1 <= local_40) break;
    ppTVar2 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::operator[]
                        ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&ndx,local_40)
    ;
    tcu::TestNode::addChild((TestNode *)this,*ppTVar2);
    local_40 = local_40 + 1;
  }
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&ndx);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		ShaderCaseFactory				caseFactory	(m_testCtx);
		const vector<tcu::TestNode*>	children	= glu::sl::parseFile(m_testCtx.getArchive(), m_filename, &caseFactory);

		for (size_t ndx = 0; ndx < children.size(); ndx++)
		{
			try
			{
				addChild(children[ndx]);
			}
			catch (...)
			{
				for (; ndx < children.size(); ndx++)
					delete children[ndx];
				throw;
			}
		}
	}